

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_dec.c
# Opt level: O0

VP8StatusCode WebPFlipBuffer(WebPDecBuffer *buffer)

{
  int iVar1;
  long lVar2;
  WEBP_CSP_MODE *in_RDI;
  int64_t H;
  WebPYUVABuffer *buf_1;
  WebPRGBABuffer *buf;
  VP8StatusCode local_4;
  
  if (in_RDI == (WEBP_CSP_MODE *)0x0) {
    local_4 = VP8_STATUS_INVALID_PARAM;
  }
  else {
    iVar1 = WebPIsRGBMode(*in_RDI);
    if (iVar1 == 0) {
      lVar2 = (long)(int)in_RDI[2];
      *(long *)(in_RDI + 4) = (lVar2 + -1) * (long)(int)in_RDI[0xc] + *(undefined8 *)(in_RDI + 4);
      in_RDI[0xc] = -in_RDI[0xc];
      *(long *)(in_RDI + 6) =
           (lVar2 + -1 >> 1) * (long)(int)in_RDI[0xd] + *(undefined8 *)(in_RDI + 6);
      in_RDI[0xd] = -in_RDI[0xd];
      *(long *)(in_RDI + 8) =
           (lVar2 + -1 >> 1) * (long)(int)in_RDI[0xe] + *(undefined8 *)(in_RDI + 8);
      in_RDI[0xe] = -in_RDI[0xe];
      if (*(undefined8 *)(in_RDI + 10) != MODE_RGB) {
        *(long *)(in_RDI + 10) =
             (lVar2 + -1) * (long)(int)in_RDI[0xf] + *(undefined8 *)(in_RDI + 10);
        in_RDI[0xf] = -in_RDI[0xf];
      }
    }
    else {
      *(long *)(in_RDI + 4) =
           (long)(int)(in_RDI[2] - MODE_RGBA) * (long)(int)in_RDI[6] + *(undefined8 *)(in_RDI + 4);
      in_RDI[6] = -in_RDI[6];
    }
    local_4 = VP8_STATUS_OK;
  }
  return local_4;
}

Assistant:

VP8StatusCode WebPFlipBuffer(WebPDecBuffer* const buffer) {
  if (buffer == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  if (WebPIsRGBMode(buffer->colorspace)) {
    WebPRGBABuffer* const buf = &buffer->u.RGBA;
    buf->rgba += (int64_t)(buffer->height - 1) * buf->stride;
    buf->stride = -buf->stride;
  } else {
    WebPYUVABuffer* const buf = &buffer->u.YUVA;
    const int64_t H = buffer->height;
    buf->y += (H - 1) * buf->y_stride;
    buf->y_stride = -buf->y_stride;
    buf->u += ((H - 1) >> 1) * buf->u_stride;
    buf->u_stride = -buf->u_stride;
    buf->v += ((H - 1) >> 1) * buf->v_stride;
    buf->v_stride = -buf->v_stride;
    if (buf->a != NULL) {
      buf->a += (H - 1) * buf->a_stride;
      buf->a_stride = -buf->a_stride;
    }
  }
  return VP8_STATUS_OK;
}